

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::SourceCodeInfo::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  SourceCodeInfo_Location *this_00;
  void *pvVar2;
  bool bVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  iVar1 = (this->location_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (SourceCodeInfo_Location *)
                ((this->location_).super_RepeatedPtrFieldBase.rep_)->elements[iVar8];
      *target = '\n';
      uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[1] = (byte)uVar6;
        puVar4 = target + 2;
      }
      else {
        target[1] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[2] = (uint8)(uVar6 >> 7);
          puVar4 = target + 3;
        }
        else {
          puVar4 = target + 3;
          uVar6 = uVar6 >> 7;
          do {
            puVar5 = puVar4;
            puVar5[-1] = (byte)uVar6 | 0x80;
            uVar7 = uVar6 >> 7;
            puVar4 = puVar5 + 1;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar7;
          } while (bVar3);
          *puVar5 = (uint8)uVar7;
        }
      }
      target = SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
                         (this_00,puVar4,stream);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SourceCodeInfo::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_location_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(1, this->_internal_location(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo)
  return target;
}